

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O0

void __thiscall
leveldb::CacheTest_UseExceedsCacheSize_Test::TestBody(CacheTest_UseExceedsCacheSize_Test *this)

{
  Cache *pCVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  char *message;
  reference ppHVar5;
  int local_70;
  int i_2;
  Message local_60;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  Handle *pHStack_38;
  int i_1;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_> h;
  CacheTest_UseExceedsCacheSize_Test *this_local;
  
  h.super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::vector
            ((vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_> *)local_28
            );
  for (local_2c = 0; local_2c < 0x44c; local_2c = local_2c + 1) {
    pHStack_38 = CacheTest::InsertAndReturnHandle
                           (&this->super_CacheTest,local_2c + 1000,local_2c + 2000,1);
    std::vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::push_back
              ((vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_> *)
               local_28,&stack0xffffffffffffffc8);
  }
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      uVar3 = (ulong)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
      sVar4 = std::vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::size
                        ((vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                          *)local_28), uVar3 < sVar4;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    local_54 = gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_ + 2000;
    local_58 = CacheTest::Lookup(&this->super_CacheTest,
                                 gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_ + 1000);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_50,"2000 + i","Lookup(1000 + i)",&local_54,&local_58);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar2) {
      testing::Message::Message(&local_60);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                 ,0xa2,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
      testing::Message::~Message(&local_60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    if (!bVar2) goto LAB_0010c866;
  }
  for (local_70 = 0;
      sVar4 = std::vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::size
                        ((vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                          *)local_28), (ulong)(long)local_70 < sVar4; local_70 = local_70 + 1) {
    pCVar1 = (this->super_CacheTest).cache_;
    ppHVar5 = std::vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::
              operator[]((vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                          *)local_28,(long)local_70);
    (*pCVar1->_vptr_Cache[4])(pCVar1,*ppHVar5);
  }
LAB_0010c866:
  std::vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::~vector
            ((vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_> *)local_28
            );
  return;
}

Assistant:

TEST_F(CacheTest, UseExceedsCacheSize) {
  // Overfill the cache, keeping handles on all inserted entries.
  std::vector<Cache::Handle*> h;
  for (int i = 0; i < kCacheSize + 100; i++) {
    h.push_back(InsertAndReturnHandle(1000 + i, 2000 + i));
  }

  // Check that all the entries can be found in the cache.
  for (int i = 0; i < h.size(); i++) {
    ASSERT_EQ(2000 + i, Lookup(1000 + i));
  }

  for (int i = 0; i < h.size(); i++) {
    cache_->Release(h[i]);
  }
}